

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel.h
# Opt level: O0

void __thiscall Dashel::Stream::Stream(Stream *this,string *protocolName)

{
  string *protocolName_local;
  Stream *this_local;
  
  this->_vptr_Stream = (_func_int **)&PTR__Stream_00151688;
  this->failedFlag = false;
  std::__cxx11::string::string((string *)&this->failReason);
  ParameterSet::ParameterSet(&this->target);
  std::__cxx11::string::string((string *)&this->protocolName,(string *)protocolName);
  return;
}

Assistant:

explicit Stream(const std::string& protocolName) :
			failedFlag(false),
			protocolName(protocolName) {}